

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  Comparator *pCVar1;
  FileMetaData *pFVar2;
  pointer __last;
  bool bVar3;
  int iVar4;
  uint uVar5;
  pointer ppFVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  long in_FS_OFFSET;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  Slice local_a0;
  Slice local_90;
  FileMetaData *local_80;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_78;
  Slice local_58;
  char *local_48;
  size_t local_40;
  long local_38;
  
  local_58.size_ = internal_key.size_;
  local_58.data_ = internal_key.data_;
  local_40 = user_key.size_;
  local_48 = user_key.data_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->vset_->icmp_).user_comparator_;
  local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
  local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
  local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            (&local_78,
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)this->files_[0].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppFVar6 = this->files_[0].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->files_[0].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar6) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      local_80 = ppFVar6[uVar7];
      local_90 = InternalKey::user_key(&local_80->smallest);
      iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_48,&local_90);
      if (-1 < iVar4) {
        local_a0 = InternalKey::user_key(&local_80->largest);
        iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_48,&local_a0);
        if (iVar4 < 1) {
          if (local_78.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_78.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
            _M_realloc_insert<leveldb::FileMetaData*const&>
                      ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                       &local_78,
                       (iterator)
                       local_78.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_80);
          }
          else {
            *local_78.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_80;
            local_78.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_78.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      ppFVar6 = this->files_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar8 < (ulong)((long)this->files_[0].
                                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3)
      ;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  __last = local_78.
           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppFVar6 = local_78.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_78.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
              ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_78.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )local_78.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)
                0xd3da9c);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
              ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )ppFVar6,
               (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                )__last,(_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>
                        )0xd3da9c);
    if (local_78.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_78.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar7 = 0;
      uVar8 = 1;
      do {
        bVar3 = (*func)(arg,0,local_78.
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7]);
        if (!bVar3) goto LAB_00d3da01;
        bVar3 = uVar8 < (ulong)((long)local_78.
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar3);
    }
  }
  files = this->files_;
  lVar9 = -6;
  do {
    files = files + 1;
    lVar10 = (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(files->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
    if (lVar10 == 0) {
      iVar4 = 10;
    }
    else {
      uVar5 = FindFile(&this->vset_->icmp_,files,&local_58);
      iVar4 = 0;
      if ((ulong)uVar5 < (ulong)(lVar10 >> 3)) {
        pFVar2 = (files->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar5];
        local_90 = InternalKey::user_key(&pFVar2->smallest);
        iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_48,&local_90);
        if (-1 < iVar4) {
          bVar3 = (*func)(arg,(int)lVar9 + 7,pFVar2);
          iVar4 = 1;
          if (!bVar3) goto LAB_00d3d9eb;
        }
        iVar4 = 0;
      }
    }
LAB_00d3d9eb:
    if ((iVar4 != 10) && (iVar4 != 0)) break;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0);
LAB_00d3da01:
  if (local_78.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (FileMetaData **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}